

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O3

int __thiscall CLineInput::OffsetFromDisplayToActual(CLineInput *this,int DisplayOffset)

{
  int iVar1;
  int PrevOffset;
  int cursor;
  
  if (this->m_Hidden == true) {
    if (DisplayOffset < 1) {
      DisplayOffset = 0;
    }
    else {
      cursor = 0;
      iVar1 = DisplayOffset;
      do {
        DisplayOffset = str_utf8_forward(this->m_pStr,cursor);
        if (DisplayOffset == cursor) {
          return cursor;
        }
        iVar1 = iVar1 + -1;
        cursor = DisplayOffset;
      } while (iVar1 != 0);
    }
  }
  return DisplayOffset;
}

Assistant:

int CLineInput::OffsetFromDisplayToActual(int DisplayOffset) const
{
	if(!IsHidden())
		return DisplayOffset;
	int ActualOffset = 0;
	for(int i = 0; i < DisplayOffset; i++)
	{
		const int PrevOffset = ActualOffset;
		ActualOffset = str_utf8_forward(m_pStr, ActualOffset);
		if(ActualOffset == PrevOffset)
			break;
	}
	return ActualOffset;
}